

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

double __thiscall Clasp::ClaspFacade::SolveData::BoundArray::_at(BoundArray *this,uint32_t idx)

{
  uint32 uVar1;
  wsum_t wVar2;
  double dVar3;
  
  uVar1 = size(this);
  if (idx < uVar1) {
    wVar2 = _bound(this->data,this->type,idx);
    if (wVar2 == 0x7fffffffffffffff) {
      dVar3 = INFINITY;
    }
    else {
      dVar3 = (double)wVar2;
    }
    return dVar3;
  }
  Potassco::fail(-2,"double Clasp::ClaspFacade::SolveData::BoundArray::_at(uint32_t) const",0x1c6,
                 "idx < size()","expired key",0);
}

Assistant:

double _at(uint32_t idx) const {
			POTASSCO_REQUIRE(idx < size(), "expired key");
			const wsum_t bound = data->_bound(type, idx);
			return bound != SharedMinimizeData::maxBound()
				? static_cast<double>(bound)
				: std::numeric_limits<double>::infinity();
		}